

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Thread::PushValues(Thread *this,ValueTypes *types,Values *values)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference __x;
  value_type_conflict5 local_30;
  Enum local_2c;
  ulong local_28;
  size_t i;
  Values *values_local;
  ValueTypes *types_local;
  Thread *this_local;
  
  i = (size_t)values;
  values_local = (Values *)types;
  types_local = (ValueTypes *)this;
  sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
  sVar4 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                    ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)i);
  if (sVar3 != sVar4) {
    __assert_fail("types.size() == values.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp.cc"
                  ,0x39f,"void wabt::interp::Thread::PushValues(const ValueTypes &, const Values &)"
                 );
  }
  for (local_28 = 0; uVar1 = local_28,
      sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)values_local),
      uVar1 < sVar3; local_28 = local_28 + 1) {
    pvVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                       ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)values_local,local_28);
    local_2c = pvVar5->enum_;
    bVar2 = IsReference((ValueType)local_2c);
    if (bVar2) {
      sVar3 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                        (&this->values_);
      local_30 = (value_type_conflict5)sVar3;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->refs_,&local_30);
    }
    __x = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                    ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)i,local_28
                    );
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::push_back
              (&this->values_,__x);
  }
  return;
}

Assistant:

void Thread::PushValues(const ValueTypes& types, const Values& values) {
  assert(types.size() == values.size());
  for (size_t i = 0; i < types.size(); ++i) {
    if (IsReference(types[i])) {
      refs_.push_back(values_.size());
    }
    values_.push_back(values[i]);
  }
}